

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreLowerPeeps.cpp
# Opt level: O0

Instr * Lowerer::TryShiftAdd(Instr *instrAdd,Opnd *opndFold,Opnd *opndAdd)

{
  StackSym *sym;
  StackSym *sym_00;
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  uint uVar4;
  uint uVar5;
  int32 offset;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  Instr *this;
  Opnd *pOVar8;
  IntConstOpnd *pIVar9;
  long lVar10;
  RegOpnd *indexOpnd;
  JITTimeFunctionBody *pJVar11;
  char16 *pcVar12;
  Instr *local_88;
  Instr *leaInstr;
  IndirOpnd *leaOpnd;
  Instr *instrIter;
  Instr *instrIterStop;
  Instr *__prevInstrCheck;
  StackSym *foldSym;
  StackSym *defSrc1Sym;
  IntConstType constVal;
  byte scale;
  Instr *instrDef;
  Opnd *opndAdd_local;
  Opnd *opndFold_local;
  Instr *instrAdd_local;
  
  if (instrAdd->m_opcode != Add_I4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                       ,0x29,"(instrAdd->m_opcode == Js::OpCode::Add_I4)",
                       "instrAdd->m_opcode == Js::OpCode::Add_I4");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = IR::Opnd::GetIsDead(opndFold);
  instrAdd_local = instrAdd;
  if ((bVar2) &&
     (((bVar2 = IR::Opnd::IsRegOpnd(opndAdd), bVar2 ||
       ((bVar2 = IR::Opnd::IsInt32(opndAdd), bVar2 &&
        (bVar2 = IR::Opnd::IsIntConstOpnd(opndAdd), bVar2)))) &&
      (bVar2 = IR::Opnd::IsRegOpnd(opndFold), bVar2)))) {
    pRVar7 = IR::Opnd::AsRegOpnd(opndFold);
    bVar2 = StackSym::IsSingleDef(pRVar7->m_sym);
    if (bVar2) {
      pRVar7 = IR::Opnd::AsRegOpnd(opndFold);
      this = StackSym::GetInstrDef(pRVar7->m_sym);
      if ((this->m_opcode == Shl_I4) || (this->m_opcode == Mul_I4)) {
        pOVar8 = IR::Instr::GetSrc1(this);
        bVar2 = IR::Opnd::IsRegOpnd(pOVar8);
        if (bVar2) {
          pOVar8 = IR::Instr::GetSrc2(this);
          bVar2 = IR::Opnd::IsIntConstOpnd(pOVar8);
          if ((bVar2) && (bVar2 = IR::Instr::HasBailOutInfo(this), !bVar2)) {
            pOVar8 = IR::Instr::GetSrc2(this);
            pIVar9 = IR::Opnd::AsIntConstOpnd(pOVar8);
            lVar10 = IR::EncodableOpnd<long>::GetValue(&pIVar9->super_EncodableOpnd<long>);
            if (this->m_opcode == Shl_I4) {
              if (lVar10 < 0) {
                return instrAdd;
              }
              if (3 < lVar10) {
                return instrAdd;
              }
              constVal._7_1_ = (byte)lVar10;
            }
            else {
              if (this->m_opcode != Mul_I4) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                                   ,0x51,"(instrDef->m_opcode == Js::OpCode::Mul_I4)",
                                   "instrDef->m_opcode == Js::OpCode::Mul_I4");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 0;
              }
              switch(lVar10) {
              case 1:
                constVal._7_1_ = '\0';
                break;
              case 2:
                constVal._7_1_ = '\x01';
                break;
              default:
                return instrAdd;
              case 4:
                constVal._7_1_ = '\x02';
                break;
              case 8:
                constVal._7_1_ = '\x03';
              }
            }
            pOVar8 = IR::Instr::GetSrc1(this);
            pRVar7 = IR::Opnd::AsRegOpnd(pOVar8);
            sym = pRVar7->m_sym;
            pRVar7 = IR::Opnd::AsRegOpnd(opndFold);
            sym_00 = pRVar7->m_sym;
            instrIterStop = (Instr *)0x0;
            if (instrAdd->m_prev == (Instr *)0x0) {
              local_88 = (Instr *)0x0;
            }
            else {
              local_88 = instrAdd->m_prev->m_next;
            }
            for (leaOpnd = (IndirOpnd *)this->m_next; (Instr *)leaOpnd != local_88;
                leaOpnd = (IndirOpnd *)leaOpnd->m_baseOpnd) {
              if ((instrIterStop != (Instr *)0x0) && (instrIterStop->m_next != (Instr *)leaOpnd)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                                   ,0x67,
                                   "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instrIter)"
                                   ,"Modifying instr list but not using EDITING iterator!");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 0;
              }
              instrIterStop = (Instr *)leaOpnd;
              bVar2 = IR::Instr::IsBranchInstr((Instr *)leaOpnd);
              if (bVar2) {
                return instrAdd;
              }
              bVar2 = IR::Instr::HasBailOutInfo((Instr *)leaOpnd);
              if (bVar2) {
                return instrAdd;
              }
              pRVar7 = IR::Instr::FindRegDef((Instr *)leaOpnd,sym);
              if (pRVar7 != (RegOpnd *)0x0) {
                return instrAdd;
              }
              bVar2 = IR::Instr::HasSymUse((Instr *)leaOpnd,sym_00);
              if (bVar2) {
                return instrAdd;
              }
            }
            uVar4 = Func::GetSourceContextId(instrAdd->m_func);
            uVar5 = Func::GetLocalFunctionId(instrAdd->m_func);
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,PreLowererPeepsPhase,uVar4,uVar5);
            if (bVar2) {
              pJVar11 = Func::GetJITFunctionBody(instrAdd->m_func);
              pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
              uVar4 = Func::GetFunctionNumber(instrAdd->m_func);
              Output::Print(L"PeepShiftAdd : %s (%d) : folding:\n",pcVar12,(ulong)uVar4);
              IR::Instr::Dump(this);
              IR::Instr::Dump(instrAdd);
            }
            bVar2 = IR::Opnd::IsRegOpnd(opndAdd);
            if (bVar2) {
              pRVar7 = IR::Opnd::AsRegOpnd(opndAdd);
              pOVar8 = IR::Instr::UnlinkSrc1(this);
              indexOpnd = IR::Opnd::AsRegOpnd(pOVar8);
              IVar3 = IR::Opnd::GetType(opndFold);
              leaInstr = (Instr *)IR::IndirOpnd::New(pRVar7,indexOpnd,constVal._7_1_,IVar3,
                                                     instrAdd->m_func);
            }
            else {
              bVar2 = IR::Opnd::IsInt32(opndAdd);
              if ((!bVar2) || (bVar2 = IR::Opnd::IsIntConstOpnd(opndAdd), !bVar2)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                                   ,0x8c,"(opndAdd->IsInt32() && opndAdd->IsIntConstOpnd())",
                                   "opndAdd->IsInt32() && opndAdd->IsIntConstOpnd()");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 0;
              }
              pOVar8 = IR::Instr::UnlinkSrc1(this);
              pRVar7 = IR::Opnd::AsRegOpnd(pOVar8);
              pIVar9 = IR::Opnd::AsIntConstOpnd(opndAdd);
              offset = IR::IntConstOpnd::AsInt32(pIVar9);
              IVar3 = IR::Opnd::GetType(opndFold);
              leaInstr = (Instr *)IR::IndirOpnd::New(pRVar7,offset,constVal._7_1_,IVar3,
                                                     instrAdd->m_func);
            }
            pOVar8 = IR::Instr::UnlinkDst(instrAdd);
            pRVar7 = IR::Opnd::AsRegOpnd(pOVar8);
            instrAdd_local = InsertLea(pRVar7,(Opnd *)leaInstr,instrAdd);
            uVar4 = Func::GetSourceContextId(instrAdd->m_func);
            uVar5 = Func::GetLocalFunctionId(instrAdd->m_func);
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,PreLowererPeepsPhase,uVar4,uVar5);
            if (bVar2) {
              pJVar11 = Func::GetJITFunctionBody(instrAdd->m_func);
              pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
              uVar4 = Func::GetFunctionNumber(instrAdd->m_func);
              Output::Print(L"into:\n",pcVar12,(ulong)uVar4);
              IR::Instr::Dump(instrAdd_local);
            }
            IR::Instr::Remove(instrAdd);
            IR::Instr::Remove(this);
          }
        }
      }
    }
  }
  return instrAdd_local;
}

Assistant:

IR::Instr *
Lowerer::TryShiftAdd(IR::Instr *instrAdd, IR::Opnd * opndFold, IR::Opnd * opndAdd)
{
    Assert(instrAdd->m_opcode == Js::OpCode::Add_I4);
    if (!opndFold->GetIsDead())
    {
        return instrAdd;
    }

    if (!(opndAdd->IsRegOpnd() || (opndAdd->IsInt32() && opndAdd->IsIntConstOpnd())))
    {
        return instrAdd;
    }

    if (!opndFold->IsRegOpnd() || !opndFold->AsRegOpnd()->m_sym->IsSingleDef())
    {
        return instrAdd;
    }

    IR::Instr * instrDef = opndFold->AsRegOpnd()->m_sym->GetInstrDef();

    if ((instrDef->m_opcode != Js::OpCode::Shl_I4 && instrDef->m_opcode != Js::OpCode::Mul_I4) || !instrDef->GetSrc1()->IsRegOpnd()  || !instrDef->GetSrc2()->IsIntConstOpnd())
    {
        return instrAdd;
    }

    if (instrDef->HasBailOutInfo())
    {
        return instrAdd;
    }

    byte scale = 0;
    IntConstType constVal = instrDef->GetSrc2()->AsIntConstOpnd()->GetValue();
    if (instrDef->m_opcode == Js::OpCode::Shl_I4)
    {
        if (constVal < 0 || constVal > 3)
        {
            return instrAdd;
        }
        scale = (byte)constVal;
    }
    else
    {
        Assert(instrDef->m_opcode == Js::OpCode::Mul_I4);
        switch (constVal)
        {
        case 1:
            scale = 0;
            break;
        case 2:
            scale = 1;
            break;
        case 4:
            scale = 2;
            break;
        case 8:
            scale = 3;
            break;
        default:
            return instrAdd;
        }
    }

    StackSym * defSrc1Sym = instrDef->GetSrc1()->AsRegOpnd()->m_sym;
    StackSym * foldSym = opndFold->AsRegOpnd()->m_sym;
    FOREACH_INSTR_IN_RANGE(instrIter, instrDef->m_next, instrAdd->m_prev)
    {
        // if any branch between def-use, don't do peeps on it because branch target might depend on the def
        if (instrIter->IsBranchInstr())
        {
            return instrAdd;
        }
        if (instrIter->HasBailOutInfo())
        {
            return instrAdd;
        }
        if (instrIter->FindRegDef(defSrc1Sym))
        {
            return instrAdd;
        }
        if (instrIter->HasSymUse(foldSym))
        {
            return instrAdd;
        }
    } NEXT_INSTR_IN_RANGE;

#if DBG_DUMP
    if (PHASE_TRACE(Js::PreLowererPeepsPhase, instrAdd->m_func))
    {
        Output::Print(_u("PeepShiftAdd : %s (%d) : folding:\n"), instrAdd->m_func->GetJITFunctionBody()->GetDisplayName(), instrAdd->m_func->GetFunctionNumber());
        instrDef->Dump();
        instrAdd->Dump();
    }
#endif

    IR::IndirOpnd * leaOpnd = nullptr;
    if (opndAdd->IsRegOpnd())
    {
        leaOpnd = IR::IndirOpnd::New(opndAdd->AsRegOpnd(), instrDef->UnlinkSrc1()->AsRegOpnd(), scale, opndFold->GetType(), instrAdd->m_func);
    }
    else
    {
        Assert(opndAdd->IsInt32() && opndAdd->IsIntConstOpnd());
        leaOpnd = IR::IndirOpnd::New(instrDef->UnlinkSrc1()->AsRegOpnd(), opndAdd->AsIntConstOpnd()->AsInt32(), scale, opndFold->GetType(), instrAdd->m_func);
    }

    IR::Instr * leaInstr = InsertLea(instrAdd->UnlinkDst()->AsRegOpnd(), leaOpnd, instrAdd);

#if DBG_DUMP
    if (PHASE_TRACE(Js::PreLowererPeepsPhase, instrAdd->m_func))
    {
        Output::Print(_u("into:\n"), instrAdd->m_func->GetJITFunctionBody()->GetDisplayName(), instrAdd->m_func->GetFunctionNumber());
        leaInstr->Dump();
    }
#endif

    instrAdd->Remove();
    instrDef->Remove();

    return leaInstr;
}